

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionEvaluator.cpp
# Opt level: O0

void __thiscall
OpenMD::SelectionEvaluator::withinInstruction
          (SelectionEvaluator *this,Token *instruction,SelectionSet *bs,int frame)

{
  bool bVar1;
  any *in_RDI;
  float distance;
  any withinSpec;
  int in_stack_00000434;
  RealType in_stack_00000438;
  SelectionSet *in_stack_00000440;
  DistanceFinder *in_stack_00000448;
  string *in_stack_ffffffffffffff58;
  SelectionEvaluator *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  allocator<char> *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  
  std::any::any(in_RDI,(any *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  std::any::type((any *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  bVar1 = std::type_info::operator==
                    ((type_info *)in_RDI,
                     (type_info *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  if (bVar1) {
    std::any_cast<float>((any *)in_stack_ffffffffffffff60);
  }
  else {
    std::any::type((any *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    bVar1 = std::type_info::operator==
                      ((type_info *)in_RDI,
                       (type_info *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    if (bVar1) {
      std::any_cast<int>((any *)in_stack_ffffffffffffff60);
    }
    else {
      in_stack_ffffffffffffff60 = (SelectionEvaluator *)&stack0xffffffffffffff97;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
      evalError(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff98);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff97);
      SelectionSet::clearAll((SelectionSet *)in_stack_ffffffffffffff60);
    }
  }
  DistanceFinder::find(in_stack_00000448,in_stack_00000440,in_stack_00000438,in_stack_00000434);
  SelectionSet::operator=
            ((SelectionSet *)in_stack_ffffffffffffff60,(SelectionSet *)in_stack_ffffffffffffff58);
  SelectionSet::~SelectionSet((SelectionSet *)0x3c5ca9);
  std::any::~any((any *)0x3c5cb3);
  return;
}

Assistant:

void SelectionEvaluator::withinInstruction(const Token& instruction,
                                             SelectionSet& bs, int frame) {
    std::any withinSpec = instruction.value;
    float distance(0.0);
    if (withinSpec.type() == typeid(float)) {
      distance = std::any_cast<float>(withinSpec);
    } else if (withinSpec.type() == typeid(int)) {
      distance = std::any_cast<int>(withinSpec);
    } else {
      evalError("casting error in withinInstruction");
      bs.clearAll();
    }

    bs = distanceFinder.find(bs, distance, frame);
  }